

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void string8_suite::test_two(void)

{
  undefined4 local_80;
  value local_7c [5];
  type local_68;
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [4];
  
  decoder.current.view._M_str._4_4_ = 0x424102a9;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[4]>
            ((decoder *)local_38,(uchar (*) [4])((long)&decoder.current.view._M_str + 4));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xa9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::string8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x431,"void string8_suite::test_two()",local_40,&local_44);
  trial::protocol::bintoken::detail::decoder::value<trial::protocol::bintoken::token::string>
            (&local_68,(decoder *)local_38);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("decoder.value<token::string>()","\"AB\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x432,"void string8_suite::test_two()",&local_68,"AB");
  std::__cxx11::string::~string((string *)&local_68);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_7c[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_80 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x434,"void string8_suite::test_two()",local_7c,&local_80);
  return;
}

Assistant:

void test_two()
{
    const value_type input[] = { token::code::string8, 0x02, 0x41, 0x42 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string8);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::string>(), "AB");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}